

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.hpp
# Opt level: O2

void __thiscall CholeskyFactor::solveLT(CholeskyFactor *this,QpVector *rhs)

{
  long lVar1;
  int iVar2;
  pointer pdVar3;
  pointer pdVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  double dVar9;
  
  lVar5 = (long)rhs->dim;
  pdVar3 = (rhs->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar2 = this->current_k_max;
  pdVar4 = (this->L).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar6 = lVar5 * 8;
  lVar7 = lVar5;
  while (lVar6 = lVar6 + -8, 0 < lVar7) {
    lVar1 = lVar7 + -1;
    dVar9 = 0.0;
    for (lVar8 = lVar5; lVar7 < lVar8; lVar8 = lVar8 + -1) {
      dVar9 = dVar9 + (rhs->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar8 + -1] *
                      *(double *)
                       ((long)(this->L).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start +
                       lVar8 * 8 + this->current_k_max * lVar6 + -8);
    }
    pdVar3[lVar1] = (pdVar3[lVar1] - dVar9) / pdVar4[(iVar2 + 1) * (int)lVar1];
    lVar7 = lVar1;
  }
  return;
}

Assistant:

void solveLT(QpVector& rhs) {
    for (HighsInt i = rhs.dim - 1; i >= 0; i--) {
      double sum = 0.0;
      for (HighsInt j = rhs.dim - 1; j > i; j--) {
        sum += rhs.value[j] * L[i * current_k_max + j];
      }
      rhs.value[i] = (rhs.value[i] - sum) / L[i * current_k_max + i];
    }
  }